

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LoopContinueLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loopcontinue(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x271) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x271;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.loopcontinue_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LoopContinueLayerParams>
                   (arena);
    (this->layer_).loopcontinue_ = (LoopContinueLayerParams *)LVar2;
  }
  return (LoopContinueLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopContinueLayerParams* NeuralNetworkLayer::_internal_mutable_loopcontinue() {
  if (!_internal_has_loopcontinue()) {
    clear_layer();
    set_has_loopcontinue();
    layer_.loopcontinue_ = CreateMaybeMessage< ::CoreML::Specification::LoopContinueLayerParams >(GetArenaForAllocation());
  }
  return layer_.loopcontinue_;
}